

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryResolution.hpp
# Opt level: O0

Option<Kernel::Clause_*> __thiscall
Inferences::ALASCA::BinaryResolutionConf::applyRule_
          (BinaryResolutionConf *this,SelectedLiteral *lhs,uint lhsVarBank,SelectedLiteral *rhs,
          uint rhsVarBank,AbstractingUnifier *uwa)

{
  uint uVar1;
  Clause *pCVar2;
  uint in_ECX;
  SelectedLiteral *in_RDX;
  Value extraout_RDX;
  long in_RSI;
  void *in_RDI;
  SelectedLiteral *in_R8;
  Option<Kernel::Clause_*> OVar4;
  Clause *res;
  Literal *in_stack_00000070;
  Clause *in_stack_00000078;
  Clause *in_stack_00000088;
  SaturationAlgorithm *in_stack_000000b0;
  Clause **t;
  uint local_2c;
  SelectedLiteral *local_28;
  uint local_1c;
  SelectedLiteral *local_18 [3];
  Value VVar3;
  
  local_28 = in_R8;
  local_18[0] = in_RDX;
  uVar1 = subsTreeQueryBank(0);
  if (in_ECX != uVar1) {
    std::swap<Kernel::SelectedLiteral_const*>(local_18,&local_28);
    std::swap<unsigned_int>(&local_1c,&local_2c);
  }
  Kernel::SelectedLiteral::clause(local_18[0]);
  Kernel::SelectedLiteral::literal((SelectedLiteral *)0xaf5df0);
  Kernel::SelectedLiteral::clause(local_28);
  Kernel::SelectedLiteral::literal((SelectedLiteral *)0xaf5e0e);
  t = *(Clause ***)(in_RSI + 0x10);
  pCVar2 = Inferences::BinaryResolution::generateClause
                     (in_stack_00000088,(Literal *)uwa,in_stack_00000078,in_stack_00000070,
                      (AbstractingUnifier *)this,(Options *)lhs,in_stack_000000b0);
  if (pCVar2 == (Clause *)0x0) {
    memset(in_RDI,0,0x10);
    Lib::Option<Kernel::Clause_*>::Option((Option<Kernel::Clause_*> *)0xaf5e6c);
    VVar3 = extraout_RDX;
  }
  else {
    OVar4 = Lib::some<Kernel::Clause*>(t);
    VVar3 = (Value)OVar4.super_OptionBase<Kernel::Clause_*>._elem._elem;
  }
  OVar4.super_OptionBase<Kernel::Clause_*>._elem._elem = (Value)(Value)VVar3.init;
  OVar4.super_OptionBase<Kernel::Clause_*>._0_8_ = in_RDI;
  return (Option<Kernel::Clause_*>)OVar4.super_OptionBase<Kernel::Clause_*>;
}

Assistant:

Option<Clause*> applyRule_(
      SelectedLiteral const* lhs, unsigned lhsVarBank,
      SelectedLiteral const* rhs, unsigned rhsVarBank,
      AbstractingUnifier& uwa
      ) const {
    if (lhsVarBank != subsTreeQueryBank(0)) {
      ASS_EQ(rhsVarBank, subsTreeQueryBank(0))
      std::swap(lhs, rhs);
      std::swap(lhsVarBank, rhsVarBank);
    }
    ASS(_salg)
    auto res = Inferences::BinaryResolution::generateClause(
        lhs->clause(), lhs->literal(), 
        rhs->clause(), rhs->literal(),
        uwa, *env.options, _salg);
    return res == nullptr ? Option<Clause*>() : some(res);
  }